

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrExtent2Di *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  uint uVar3;
  pointer pcVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  string height_prefix;
  string width_prefix;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_78.field_2;
  local_98._M_dataplus._M_p = (pointer)value;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\x12');
  *local_78._M_dataplus._M_p = '0';
  local_78._M_dataplus._M_p[1] = 'x';
  pcVar7 = local_78._M_dataplus._M_p + (local_78._M_string_length - 1);
  lVar9 = 0;
  do {
    bVar2 = *(byte *)((long)&local_98._M_dataplus._M_p + lVar9);
    *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar9 = lVar9 + 1;
    pcVar7 = pcVar7 + -2;
  } while (lVar9 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  uVar3 = value->width;
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  uVar11 = 1;
  if (9 < uVar5) {
    uVar10 = (ulong)uVar5;
    uVar6 = 4;
    do {
      uVar11 = uVar6;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_001480b4;
      }
      if (uVar8 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_001480b4;
      }
      if (uVar8 < 10000) goto LAB_001480b4;
      uVar10 = uVar10 / 10000;
      uVar6 = uVar11 + 4;
    } while (99999 < uVar8);
    uVar11 = uVar11 + 1;
  }
LAB_001480b4:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_58 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar11 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_98._M_dataplus._M_p + (uVar3 >> 0x1f),uVar11,uVar5);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            (local_58,(char (*) [8])0x2a4d98,&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_98);
  uVar3 = value->height;
  uVar5 = -uVar3;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  uVar11 = 1;
  if (9 < uVar5) {
    uVar10 = (ulong)uVar5;
    uVar6 = 4;
    do {
      uVar11 = uVar6;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_001481a8;
      }
      if (uVar8 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_001481a8;
      }
      if (uVar8 < 10000) goto LAB_001481a8;
      uVar10 = uVar10 / 10000;
      uVar6 = uVar11 + 4;
    } while (99999 < uVar8);
    uVar11 = uVar11 + 1;
  }
LAB_001481a8:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar11 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + (uVar3 >> 0x1f),uVar11,uVar5);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            (local_58,(char (*) [8])0x2a4d98,&local_98,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrExtent2Di* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string width_prefix = prefix;
        width_prefix += "width";
        contents.emplace_back("int32_t", width_prefix, std::to_string(value->width));
        std::string height_prefix = prefix;
        height_prefix += "height";
        contents.emplace_back("int32_t", height_prefix, std::to_string(value->height));
        return true;
    } catch(...) {
    }
    return false;
}